

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

wchar_t assertion_file_contains_lines_any_order(char *file,wchar_t line,char *pathname,char **lines)

{
  char *__s1;
  int iVar1;
  char *__ptr;
  char *pcVar2;
  void *pvVar3;
  size_t sVar4;
  char cVar5;
  size_t sVar6;
  size_t __nmemb;
  long lVar7;
  size_t sVar8;
  bool bVar9;
  bool bVar10;
  size_t buff_size;
  void *local_60;
  size_t local_38;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  __ptr = slurpfile(&local_38,"%s");
  if (__ptr == (char *)0x0) {
    failure_start(pathname,line,"Can\'t read file: %s",pathname);
    failure_finish(pathname);
    return L'\0';
  }
  __nmemb = 0xffffffffffffffff;
  do {
    lVar7 = __nmemb + 1;
    __nmemb = __nmemb + 1;
  } while (lines[lVar7] != (char *)0x0);
  if (__nmemb == 0) {
    local_60 = (void *)0x0;
LAB_00104ca2:
    if ((long)local_38 < 1) {
      sVar6 = 0;
    }
    else {
      cVar5 = '\0';
      sVar6 = 0;
      pcVar2 = __ptr;
      do {
        if ((*pcVar2 == '\r') || (*pcVar2 == '\n')) {
          *pcVar2 = '\0';
        }
        if (cVar5 == '\0') {
          sVar6 = (sVar6 + 1) - (ulong)(*pcVar2 == '\0');
        }
        cVar5 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      } while (pcVar2 < __ptr + local_38);
    }
    if (sVar6 == 0) {
      pvVar3 = (void *)0x0;
    }
    else {
      pvVar3 = calloc(sVar6,8);
      if (pvVar3 == (void *)0x0) goto LAB_00104eaa;
      if (0 < (long)local_38) {
        lVar7 = 0;
        pcVar2 = __ptr;
        do {
          if (*pcVar2 != '\0') {
            *(char **)((long)pvVar3 + lVar7 * 8) = pcVar2;
            lVar7 = lVar7 + 1;
          }
          sVar4 = strlen(pcVar2);
          pcVar2 = pcVar2 + sVar4 + 1;
        } while (pcVar2 < __ptr + local_38);
      }
    }
    bVar9 = true;
    if (__nmemb != 0) {
      sVar4 = 0;
      do {
        if (sVar6 != 0) {
          sVar8 = 0;
          do {
            pcVar2 = *(char **)((long)pvVar3 + sVar8 * 8);
            if (pcVar2 != (char *)0x0) {
              __s1 = *(char **)((long)local_60 + sVar4 * 8);
              iVar1 = strcmp(__s1,pcVar2);
              if (iVar1 == 0) {
                free(__s1);
                *(undefined8 *)((long)local_60 + sVar4 * 8) = 0;
                *(undefined8 *)((long)pvVar3 + sVar8 * 8) = 0;
                break;
              }
            }
            sVar8 = sVar8 + 1;
          } while (sVar6 != sVar8);
        }
        sVar4 = sVar4 + 1;
      } while (__nmemb != sVar4);
      iVar1 = 0;
      sVar4 = 0;
      do {
        iVar1 = (iVar1 + 1) - (uint)(*(long *)((long)local_60 + sVar4 * 8) == 0);
        sVar4 = sVar4 + 1;
      } while (__nmemb != sVar4);
      bVar9 = iVar1 == 0;
    }
    bVar10 = true;
    if (sVar6 != 0) {
      iVar1 = 0;
      sVar4 = 0;
      do {
        iVar1 = (iVar1 + 1) - (uint)(*(long *)((long)pvVar3 + sVar4 * 8) == 0);
        sVar4 = sVar4 + 1;
      } while (sVar6 != sVar4);
      bVar10 = iVar1 == 0;
    }
    if ((bool)(bVar9 & bVar10)) {
      free(pvVar3);
      free(local_60);
      free(__ptr);
      return L'\x01';
    }
    failure_start(file,line,"File doesn\'t match: %s",pathname);
    if (__nmemb != 0) {
      sVar4 = 0;
      do {
        if (*(long *)((long)local_60 + sVar4 * 8) != 0) {
          logprintf("  Expected but not present: %s\n");
          file = *(char **)((long)local_60 + sVar4 * 8);
          free(file);
          *(undefined8 *)((long)local_60 + sVar4 * 8) = 0;
        }
        sVar4 = sVar4 + 1;
      } while (__nmemb != sVar4);
    }
    pathname = file;
    if (sVar6 != 0) {
      sVar4 = 0;
      do {
        if (*(long *)((long)pvVar3 + sVar4 * 8) != 0) {
          file = "  Present but not expected: %s\n";
          logprintf("  Present but not expected: %s\n");
        }
        sVar4 = sVar4 + 1;
        pathname = file;
      } while (sVar6 != sVar4);
    }
  }
  else {
    local_60 = calloc(__nmemb,8);
    if (local_60 != (void *)0x0) {
      pcVar2 = *lines;
      if (pcVar2 != (char *)0x0) {
        lVar7 = 0;
        do {
          pcVar2 = strdup(pcVar2);
          *(char **)((long)local_60 + lVar7) = pcVar2;
          if (pcVar2 == (char *)0x0) goto LAB_00104eaa;
          pcVar2 = *(char **)((long)lines + lVar7 + 8);
          lVar7 = lVar7 + 8;
        } while (pcVar2 != (char *)0x0);
      }
      goto LAB_00104ca2;
    }
    local_60 = (void *)0x0;
LAB_00104eaa:
    pvVar3 = (void *)0x0;
    failure_start(pathname,line,"Can\'t allocate memory");
  }
  failure_finish(pathname);
  free(pvVar3);
  if (local_60 != (void *)0x0) {
    if (__nmemb != 0) {
      sVar6 = 0;
      do {
        pvVar3 = *(void **)((long)local_60 + sVar6 * 8);
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
        }
        sVar6 = sVar6 + 1;
      } while (__nmemb != sVar6);
    }
    free(local_60);
  }
  free(__ptr);
  return L'\0';
}

Assistant:

int
assertion_file_contains_lines_any_order(const char *file, int line,
    const char *pathname, const char *lines[])
{
	char *buff;
	size_t buff_size;
	size_t expected_count, actual_count, i, j;
	char **expected = NULL;
	char *p, **actual = NULL;
	char c;
	int expected_failure = 0, actual_failure = 0;

	assertion_count(file, line);

	buff = slurpfile(&buff_size, "%s", pathname);
	if (buff == NULL) {
		failure_start(pathname, line, "Can't read file: %s", pathname);
		failure_finish(NULL);
		return (0);
	}

	/* Make a copy of the provided lines and count up the expected
	 * file size. */
	for (i = 0; lines[i] != NULL; ++i) {
	}
	expected_count = i;
	if (expected_count) {
		expected = calloc(expected_count, sizeof(*expected));
		if (expected == NULL) {
			failure_start(pathname, line, "Can't allocate memory");
			failure_finish(NULL);
			goto cleanup;
		}
		for (i = 0; lines[i] != NULL; ++i) {
			expected[i] = strdup(lines[i]);
			if (expected[i] == NULL) {
				failure_start(pathname, line, "Can't allocate memory");
				failure_finish(NULL);
				goto cleanup;
			}
		}
	}

	/* Break the file into lines */
	actual_count = 0;
	for (c = '\0', p = buff; p < buff + buff_size; ++p) {
		if (*p == '\x0d' || *p == '\x0a')
			*p = '\0';
		if (c == '\0' && *p != '\0')
			++actual_count;
		c = *p;
	}
	if (actual_count) {
		actual = calloc(actual_count, sizeof(char *));
		if (actual == NULL) {
			failure_start(pathname, line, "Can't allocate memory");
			failure_finish(NULL);
			goto cleanup;
		}
		for (j = 0, p = buff; p < buff + buff_size;
		    p += 1 + strlen(p)) {
			if (*p != '\0') {
				actual[j] = p;
				++j;
			}
		}
	}

	/* Erase matching lines from both lists */
	for (i = 0; i < expected_count; ++i) {
		for (j = 0; j < actual_count; ++j) {
			if (actual[j] == NULL)
				continue;
			if (strcmp(expected[i], actual[j]) == 0) {
				free(expected[i]);
				expected[i] = NULL;
				actual[j] = NULL;
				break;
			}
		}
	}

	/* If there's anything left, it's a failure */
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] != NULL)
			++expected_failure;
	}
	for (j = 0; j < actual_count; ++j) {
		if (actual[j] != NULL)
			++actual_failure;
	}
	if (expected_failure == 0 && actual_failure == 0) {
		free(actual);
		free(expected);
		free(buff);
		return (1);
	}
	failure_start(file, line, "File doesn't match: %s", pathname);
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] != NULL) {
			logprintf("  Expected but not present: %s\n", expected[i]);
			free(expected[i]);
			expected[i] = NULL;
		}
	}
	for (j = 0; j < actual_count; ++j) {
		if (actual[j] != NULL)
			logprintf("  Present but not expected: %s\n", actual[j]);
	}
	failure_finish(NULL);
cleanup:
	free(actual);
	if (expected != NULL) {
		for (i = 0; i < expected_count; ++i)
			if (expected[i] != NULL)
				free(expected[i]);
		free(expected);
	}
	free(buff);
	return (0);
}